

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O2

char * makeplural(char *oldstr)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  boolean bVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  size_t sVar10;
  char *pcVar11;
  void *pvVar12;
  char *__dest;
  char cVar13;
  uint uVar14;
  char cVar15;
  char *__src;
  char *pcVar16;
  char *pcVar17;
  
  nextobuf_bufidx = (nextobuf_bufidx + 1) % 0xc;
  lVar9 = (long)nextobuf_bufidx * 0x100;
  __dest = nextobuf_bufs + lVar9;
  for (; *oldstr == ' '; oldstr = oldstr + 1) {
  }
  if (*oldstr == '\0') {
    warning("plural of null?");
    __dest[0] = 's';
    __dest[1] = '\0';
    return __dest;
  }
  strcpy(__dest,oldstr);
  iVar7 = strncmp(__dest,"pair of ",8);
  if (iVar7 == 0) {
    return __dest;
  }
  iVar7 = 0;
  for (pcVar16 = __dest; cVar15 = *pcVar16, cVar15 != '\0'; pcVar16 = pcVar16 + 1) {
    iVar8 = strncmp(pcVar16," of ",4);
    if ((((((iVar8 == 0) || (iVar8 = strncmp(pcVar16," [of ",5), iVar8 == 0)) ||
          (iVar8 = strncmp(pcVar16," labeled ",9), iVar8 == 0)) ||
         ((iVar8 = strncmp(pcVar16," called ",8), iVar8 == 0 ||
          (iVar8 = strncmp(pcVar16," named ",7), iVar8 == 0)))) ||
        (iVar8 = strcmp(pcVar16," above"), iVar8 == 0)) ||
       (((((iVar8 = strncmp(pcVar16," versus ",8), iVar8 == 0 ||
           (iVar8 = strncmp(pcVar16," from ",6), iVar8 == 0)) ||
          ((iVar8 = strncmp(pcVar16," in ",4), iVar8 == 0 ||
           (((iVar8 = strncmp(pcVar16,"-in-",4), iVar8 == 0 ||
             (iVar8 = strncmp(pcVar16," on ",4), iVar8 == 0)) ||
            (iVar8 = strncmp(pcVar16," a la ",6), iVar8 == 0)))))) ||
         (((iVar8 = strncmp(pcVar16," with",5), iVar8 == 0 ||
           (iVar8 = strncmp(pcVar16," de ",4), iVar8 == 0)) ||
          ((cVar15 == ' ' && ((pcVar16[1] == 'd' && (pcVar16[2] == '\'')))))))) ||
        (iVar8 = strncmp(pcVar16," du ",4), iVar8 == 0)))) {
      __src = oldstr + iVar7;
      *pcVar16 = '\0';
      goto LAB_001f6cf7;
    }
    iVar7 = iVar7 + 1;
  }
  __src = (char *)0x0;
LAB_001f6cf7:
  do {
    pcVar17 = pcVar16;
    cVar15 = pcVar17[-1];
    pcVar16 = pcVar17 + -1;
  } while (cVar15 == ' ');
  *pcVar17 = '\0';
  sVar10 = strlen(__dest);
  uVar14 = (uint)sVar10;
  if ((uVar14 == 1) || (bVar6 = letter(cVar15), bVar6 == '\0')) {
    pcVar17[2] = '\0';
    pcVar17[0] = '\'';
    pcVar17[1] = 's';
    goto LAB_001f6d4e;
  }
  if (uVar14 == 2) {
    if (((*__dest == 'y') && (nextobuf_bufs[lVar9 + 1] == 'a')) &&
       (nextobuf_bufs[lVar9 + 2] == '\0')) goto LAB_001f6d4e;
LAB_001f6d7e:
    cVar15 = pcVar17[-2];
    if (((cVar15 == 'a') && (*pcVar16 == 'i')) && (*pcVar17 == '\0')) goto LAB_001f6d4e;
    if (uVar14 < 3) {
      bVar2 = false;
      bVar1 = false;
      bVar3 = false;
LAB_001f6f10:
      bVar4 = false;
      bVar5 = true;
      goto LAB_001f6f37;
    }
    iVar7 = strcmp(pcVar17 + -3," ya");
    if (iVar7 == 0) goto LAB_001f6d4e;
    bVar1 = uVar14 != 3;
    if (uVar14 == 3) {
LAB_001f6fd0:
      bVar3 = false;
      bVar2 = false;
    }
    else {
      pcVar11 = pcVar17 + -4;
      iVar7 = strcmp(pcVar11,"fish");
      if (((iVar7 == 0) || (iVar7 = strcmp(pcVar11,"tuna"), iVar7 == 0)) ||
         ((iVar7 = strcmp(pcVar11,"deer"), iVar7 == 0 ||
          (iVar7 = strcmp(pcVar11,"yaki"), iVar7 == 0)))) goto LAB_001f6d4e;
      if (uVar14 < 5) goto LAB_001f6fd0;
      pcVar11 = pcVar17 + -5;
      iVar7 = strcmp(pcVar11,"sheep");
      if (((((iVar7 == 0) || (iVar7 = strcmp(pcVar11,"ninja"), iVar7 == 0)) ||
           (iVar7 = strcmp(pcVar11,"ronin"), iVar7 == 0)) ||
          ((iVar7 = strcmp(pcVar11,"shito"), iVar7 == 0 ||
           (iVar7 = strcmp(pcVar17 + -8,"shuriken"), iVar7 == 0)))) ||
         ((iVar7 = strcmp(pcVar11,"tengu"), iVar7 == 0 ||
          (iVar7 = strcmp(pcVar11,"manes"), iVar7 == 0)))) goto LAB_001f6d4e;
      if (uVar14 == 5) {
        bVar2 = true;
        bVar3 = false;
      }
      else {
        iVar7 = strcmp(pcVar17 + -6,"ki-rin");
        if ((iVar7 == 0) || (iVar7 = strcmp(pcVar17 + -6,"Nazgul"), iVar7 == 0)) goto LAB_001f6d4e;
        bVar3 = true;
        if (uVar14 < 7) {
          bVar2 = true;
        }
        else {
          iVar7 = strcmp(pcVar17 + -7,"gunyoki");
          bVar2 = true;
          if (iVar7 == 0) goto LAB_001f6d4e;
        }
      }
    }
    iVar7 = strcmp(pcVar17 + -3,"man");
    if (iVar7 != 0) {
LAB_001f6ff0:
      if (bVar2) {
        iVar7 = strcmp(pcVar17 + -5,"tooth");
        bVar4 = true;
        bVar2 = true;
        bVar5 = true;
        if (iVar7 == 0) {
          builtin_strncpy(pcVar17 + -4,"eeth",5);
          goto LAB_001f6d4e;
        }
        goto LAB_001f6f37;
      }
      bVar2 = true;
      goto LAB_001f6f10;
    }
    if (5 < uVar14) {
      iVar7 = strcmp(pcVar17 + -6,"shaman");
      if (iVar7 != 0) goto LAB_001f7066;
      goto LAB_001f6ff0;
    }
    if (uVar14 == 5) {
LAB_001f7066:
      iVar7 = strcmp(pcVar17 + -5,"human");
      if (iVar7 == 0) goto LAB_001f6ff0;
    }
  }
  else {
    if (1 < (int)uVar14) goto LAB_001f6d7e;
    cVar15 = pcVar17[-2];
    bVar4 = false;
    bVar2 = false;
    bVar5 = false;
    bVar1 = false;
    bVar3 = false;
LAB_001f6f37:
    cVar13 = *pcVar16;
    if (cVar13 == 'e' && cVar15 == 'f') {
      cVar13 = 'e';
      if (*pcVar17 == '\0') {
LAB_001f6f5d:
        builtin_strncpy(pcVar17 + -2,"ves",4);
        goto LAB_001f6d4e;
      }
    }
    else if (cVar13 == 'f') {
      if ((((cVar15 == '\0') || (cVar15 == 'l')) || (cVar15 == 'r')) ||
         (pcVar11 = strchr("aeiouAEIOU",(int)cVar15), pcVar11 != (char *)0x0)) {
        builtin_strncpy(pcVar17 + -1,"ves",4);
        goto LAB_001f6d4e;
      }
      cVar13 = 'f';
      if (bVar4) {
        iVar7 = strncmp(pcVar17 + -5,"staf",4);
        cVar13 = 'f';
        if (iVar7 == 0) goto LAB_001f6f5d;
      }
    }
    if ((bVar1) && (iVar7 = strcmp(pcVar17 + -4,"foot"), iVar7 == 0)) {
      builtin_strncpy(pcVar17 + -3,"eet",4);
      goto LAB_001f6d4e;
    }
    if ((bVar2) && (iVar7 = strcmp(pcVar17 + -3,"ium"), iVar7 == 0)) {
      pcVar17[-2] = 'a';
      pcVar17[-1] = '\0';
      goto LAB_001f6d4e;
    }
    if ((bVar1) && (iVar7 = strcmp(pcVar17 + -4,"alga"), iVar7 == 0)) {
LAB_001f7330:
      pcVar17[1] = '\0';
      pcVar16[0] = 'a';
      pcVar16[1] = 'e';
      goto LAB_001f6d4e;
    }
    if (bVar4) {
      iVar7 = strcmp(pcVar17 + -5,"hypha");
      if ((iVar7 == 0) || (iVar7 = strcmp(pcVar17 + -5,"larva"), iVar7 == 0)) goto LAB_001f7330;
    }
    if (((bool)((cVar13 == 's' && cVar15 == 'u') & bVar1)) && (cVar13 = 's', *pcVar17 == '\0')) {
      if (uVar14 != 4) {
        iVar7 = strcmp(pcVar17 + -5,"lotus");
        if (iVar7 == 0) {
          cVar13 = 's';
          goto LAB_001f719f;
        }
        if (5 < (int)uVar14) {
          iVar7 = strcmp(pcVar17 + -6,"wumpus");
          cVar13 = 's';
          if (iVar7 == 0) goto LAB_001f719f;
        }
      }
      pcVar17[-2] = 'i';
      pcVar17[-1] = '\0';
      goto LAB_001f6d4e;
    }
LAB_001f719f:
    if (bVar3) {
      iVar7 = strcmp(pcVar17 + -4,"rtex");
      if (iVar7 == 0) {
        builtin_strncpy(pcVar17 + -2,"ices",5);
        goto LAB_001f6d4e;
      }
      iVar7 = strcmp(pcVar17 + -6,"djinni");
      if (iVar7 == 0) {
        *pcVar16 = '\0';
        goto LAB_001f6d4e;
      }
    }
    if ((bVar4) && (iVar7 = strcmp(pcVar17 + -5,"mumak"), iVar7 == 0)) {
      pcVar17[2] = '\0';
      pcVar17[0] = 'i';
      pcVar17[1] = 'l';
      goto LAB_001f6d4e;
    }
    if ((!bVar2) || (iVar7 = strcmp(pcVar17 + -3,"sis"), iVar7 != 0)) {
      if ((bVar3) && (iVar7 = strcmp(pcVar17 + -6,"erinys"), iVar7 == 0)) {
        pcVar17[1] = '\0';
        pcVar16[0] = 'e';
        pcVar16[1] = 's';
      }
      else if ((bVar4) &&
              ((iVar7 = strcmp(pcVar17 + -4,"ouse"), iVar7 == 0 &&
               (pvVar12 = memchr("MmLl",(int)pcVar17[-5],5), pvVar12 != (void *)0x0)))) {
        builtin_strncpy(pcVar17 + -4,"ice",4);
      }
      else {
        if (bVar3) {
          iVar7 = strcmp(pcVar17 + -6,"matzoh");
          if ((iVar7 == 0) || (iVar7 = strcmp(pcVar17 + -6,"matzah"), iVar7 == 0)) {
            *pcVar17 = '\0';
            pcVar17[-2] = 'o';
            pcVar17[-1] = 't';
            goto LAB_001f6d4e;
          }
        }
        if (bVar4) {
          iVar7 = strcmp(pcVar17 + -5,"matzo");
          if ((iVar7 == 0) || (iVar7 = strcmp(pcVar17 + -6,"matza"), iVar7 == 0)) {
            pcVar17[1] = '\0';
            pcVar16[0] = 'o';
            pcVar16[1] = 't';
            goto LAB_001f6d4e;
          }
          iVar7 = strcmp(pcVar17 + -5,"child");
          if (iVar7 == 0) {
            builtin_strncpy(pcVar17 + -1,"dren",5);
            goto LAB_001f6d4e;
          }
        }
        pvVar12 = memchr("zxs",(int)cVar13,4);
        if ((pvVar12 != (void *)0x0) ||
           (((bVar5 && cVar13 == 'h' && (((cVar15 == '\0' || (cVar15 == 'c')) || (cVar15 == 's'))))
            || ((bVar1 && (iVar7 = strcmp(pcVar17 + -3,"ato"), iVar7 == 0)))))) {
          pcVar17[2] = '\0';
          pcVar17[0] = 'e';
          pcVar17[1] = 's';
        }
        else if ((cVar13 == 'y') &&
                (pcVar16 = strchr("aeiouAEIOU",(int)cVar15), pcVar16 == (char *)0x0)) {
          builtin_strncpy(pcVar17 + -1,"ies",4);
        }
        else {
          pcVar17[0] = 's';
          pcVar17[1] = '\0';
        }
      }
      goto LAB_001f6d4e;
    }
  }
  pcVar17[-2] = 'e';
LAB_001f6d4e:
  if (__src != (char *)0x0) {
    pcVar16 = eos(__dest);
    strcpy(pcVar16,__src);
  }
  return __dest;
}

Assistant:

char *makeplural(const char *oldstr)
{
	/* Note: cannot use strcmpi here -- it'd give MATZot, CAVEMeN,... */
	char *spot;
	char *str = nextobuf();
	const char *excess = NULL;
	int len;

	while (*oldstr==' ') oldstr++;
	if (!*oldstr) {
		warning("plural of null?");
		strcpy(str, "s");
		return str;
	}
	strcpy(str, oldstr);

	/*
	 * Skip changing "pair of" to "pairs of".  According to Webster, usual
	 * English usage is use pairs for humans, e.g. 3 pairs of dancers,
	 * and pair for objects and non-humans, e.g. 3 pair of boots.  We don't
	 * refer to pairs of humans in this game so just skip to the bottom.
	 */
	if (!strncmp(str, "pair of ", 8))
		goto bottom;

	/* Search for common compounds, ex. lump of royal jelly */
	for (spot=str; *spot; spot++) {
		if (!strncmp(spot, " of ", 4)
				/* DYWYPISI: pluralize "dart [of fire]" */
				|| !strncmp(spot, " [of ", 5)
				|| !strncmp(spot, " labeled ", 9)
				|| !strncmp(spot, " called ", 8)
				|| !strncmp(spot, " named ", 7)
				|| !strcmp(spot, " above") /* lurkers above */
				|| !strncmp(spot, " versus ", 8)
				|| !strncmp(spot, " from ", 6)
				|| !strncmp(spot, " in ", 4)
				|| !strncmp(spot, "-in-", 4) /* mother-in-law */
				|| !strncmp(spot, " on ", 4)
				|| !strncmp(spot, " a la ", 6)
				|| !strncmp(spot, " with", 5)	/* " with "? */
				|| !strncmp(spot, " de ", 4)
				|| !strncmp(spot, " d'", 3)
				|| !strncmp(spot, " du ", 4)) {
			excess = oldstr + (int) (spot - str);
			*spot = 0;
			break;
		}
	}
	spot--;
	while (*spot==' ') spot--; /* Strip blanks from end */
	*(spot+1) = 0;
	/* Now spot is the last character of the string */

	len = strlen(str);

	/* Single letters */
	if (len==1 || !letter(*spot)) {
		strcpy(spot+1, "'s");
		goto bottom;
	}

	/* Same singular and plural; mostly Japanese words except for "manes" */
	if ((len == 2 && !strcmp(str, "ya")) ||
	    (len >= 2 && !strcmp(spot-1, "ai")) || /* samurai, Uruk-hai */
	    (len >= 3 && !strcmp(spot-2, " ya")) ||
	    (len >= 4 &&
	     (!strcmp(spot-3, "fish") || !strcmp(spot-3, "tuna") ||
	      !strcmp(spot-3, "deer") || !strcmp(spot-3, "yaki"))) ||
	    (len >= 5 && (!strcmp(spot-4, "sheep") ||
			!strcmp(spot-4, "ninja") ||
			!strcmp(spot-4, "ronin") ||
			!strcmp(spot-4, "shito") ||
			!strcmp(spot-7, "shuriken") ||
			!strcmp(spot-4, "tengu") ||
			!strcmp(spot-4, "manes"))) ||
	    (len >= 6 && !strcmp(spot-5, "ki-rin")) ||
	    (len >= 6 && !strcmp(spot-5, "Nazgul")) ||
	    (len >= 7 && !strcmp(spot-6, "gunyoki")))
		goto bottom;

	/* man/men ("Wiped out all cavemen.") */
	if (len >= 3 && !strcmp(spot-2, "man") &&
			(len<6 || strcmp(spot-5, "shaman")) &&
			(len<5 || strcmp(spot-4, "human"))) {
		*(spot-1) = 'e';
		goto bottom;
	}

	/* tooth/teeth */
	if (len >= 5 && !strcmp(spot-4, "tooth")) {
		strcpy(spot-3, "eeth");
		goto bottom;
	}

	/* knife/knives, etc... */
	if (!strcmp(spot-1, "fe")) {
		strcpy(spot-1, "ves");
		goto bottom;
	} else if (*spot == 'f') {
		if (strchr("lr", *(spot-1)) || strchr(vowels, *(spot-1))) {
			strcpy(spot, "ves");
			goto bottom;
		} else if (len >= 5 && !strncmp(spot-4, "staf", 4)) {
			strcpy(spot-1, "ves");
			goto bottom;
		}
	}

	/* foot/feet (body part) */
	if (len >= 4 && !strcmp(spot-3, "foot")) {
		strcpy(spot-2, "eet");
		goto bottom;
	}

	/* ium/ia (mycelia, baluchitheria) */
	if (len >= 3 && !strcmp(spot-2, "ium")) {
		*(spot--) = (char)0;
		*spot = 'a';
		goto bottom;
	}

	/* algae, larvae, hyphae (another fungus part) */
	if ((len >= 4 && !strcmp(spot-3, "alga")) ||
	    (len >= 5 &&
	     (!strcmp(spot-4, "hypha") || !strcmp(spot-4, "larva")))) {
		strcpy(spot, "ae");
		goto bottom;
	}

	/* fungus/fungi, homunculus/homunculi, but buses, lotuses, wumpuses */
	if (len > 3 && !strcmp(spot-1, "us") &&
	    (len < 5 || (strcmp(spot-4, "lotus") &&
			 (len < 6 || strcmp(spot-5, "wumpus"))))) {
		*(spot--) = (char)0;
		*spot = 'i';
		goto bottom;
	}

	/* vortex/vortices */
	if (len >= 6 && !strcmp(spot-3, "rtex")) {
		strcpy(spot-1, "ices");
		goto bottom;
	}

	/* djinni/djinn (note: also efreeti/efreet) */
	if (len >= 6 && !strcmp(spot-5, "djinni")) {
		*spot = (char)0;
		goto bottom;
	}

	/* mumak/mumakil */
	if (len >= 5 && !strcmp(spot-4, "mumak")) {
		strcpy(spot+1, "il");
		goto bottom;
	}

	/* sis/ses (nemesis) */
	if (len >= 3 && !strcmp(spot-2, "sis")) {
		*(spot-1) = 'e';
		goto bottom;
	}

	/* erinys/erinyes */
	if (len >= 6 && !strcmp(spot-5, "erinys")) {
		strcpy(spot, "es");
		goto bottom;
	}

	/* mouse/mice,louse/lice (not a monster, but possible in food names) */
	if (len >= 5 && !strcmp(spot-3, "ouse") && strchr("MmLl", *(spot-4))) {
		strcpy(spot-3, "ice");
		goto bottom;
	}

	/* matzoh/matzot, possible food name */
	if (len >= 6 && (!strcmp(spot-5, "matzoh")
					|| !strcmp(spot-5, "matzah"))) {
		strcpy(spot-1, "ot");
		goto bottom;
	}
	if (len >= 5 && (!strcmp(spot-4, "matzo")
					|| !strcmp(spot-5, "matza"))) {
		strcpy(spot, "ot");
		goto bottom;
	}

	/* child/children (for wise guys who give their food funny names) */
	if (len >= 5 && !strcmp(spot-4, "child")) {
		strcpy(spot, "dren");
		goto bottom;
	}

	/* note: -eau/-eaux (gateau, bordeau...) */
	/* note: ox/oxen, VAX/VAXen, goose/geese */

	/* Ends in z, x, s, ch, sh; add an "es" */
	if (strchr("zxs", *spot)
			|| (len >= 2 && *spot=='h' && strchr("cs", *(spot-1)))
	/* Kludge to get "tomatoes" and "potatoes" right */
			|| (len >= 4 && !strcmp(spot-2, "ato"))) {
		strcpy(spot+1, "es");
		goto bottom;
	}

	/* Ends in y preceded by consonant (note: also "qu") change to "ies" */
	if (*spot == 'y' &&
	    (!strchr(vowels, *(spot-1)))) {
		strcpy(spot, "ies");
		goto bottom;
	}

	/* Default: append an 's' */
	strcpy(spot+1, "s");

bottom:	if (excess) strcpy(eos(str), excess);
	return str;
}